

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O2

TypeDescriptor * divOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  types tVar1;
  NumberDescriptor *this;
  ostream *poVar2;
  string local_60 [32];
  string local_40 [32];
  
  if (leftValue->_type == NUMBER) {
    tVar1 = rightValue->_type;
    if (tVar1 == NUMBER) {
      this = (NumberDescriptor *)operator_new(0x60);
      NumberDescriptor::NumberDescriptor(this,leftValue->_number / rightValue->_number);
      return &this->super_TypeDescriptor;
    }
LAB_0010e321:
    if (tVar1 != STRING) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_0010e441;
    }
  }
  else if (leftValue->_type != STRING) {
    tVar1 = rightValue->_type;
    goto LAB_0010e321;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"TypeDescriptor *divOperator: ");
  std::__cxx11::string::string(local_40,(string *)&leftValue->_string);
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2," / ");
  std::__cxx11::string::string(local_60,(string *)&rightValue->_string);
  poVar2 = std::operator<<(poVar2,local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cannot divide:");
  std::__cxx11::string::string(local_40,(string *)&leftValue->_string);
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2," / ");
  std::__cxx11::string::string(local_60,(string *)&rightValue->_string);
  poVar2 = std::operator<<(poVar2,local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
LAB_0010e441:
  exit(2);
}

Assistant:

TypeDescriptor *divOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numSum = new  NumberDescriptor(leftValue->getNumber() / rightValue->getNumber());
        //std::cout << "TypeDescriptor *divOperator: " << leftValue->getNumber() << " / " << rightValue->getNumber() << std::endl;
        return numSum;
    }else if(leftValue->type() == TypeDescriptor::STRING
    || rightValue->type() == TypeDescriptor::STRING){
        std::cout << "TypeDescriptor *divOperator: " << leftValue->getString()  << " / " << rightValue->getString()  << std::endl;
        std::cout << "Cannot divide:" << leftValue->getString()  << " / " << rightValue->getString()  << std::endl;
        exit(2);
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}